

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int set_SUSP_CE(uchar *p,int location,int offset,int size)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  
  p[0] = 'C';
  p[1] = 'E';
  p[2] = '\x1c';
  p[3] = '\x01';
  p[4] = (uchar)location;
  uVar1 = (uchar)((uint)location >> 8);
  p[5] = uVar1;
  uVar2 = (uchar)((uint)location >> 0x10);
  p[6] = uVar2;
  uVar3 = (uchar)((uint)location >> 0x18);
  p[7] = uVar3;
  p[8] = uVar3;
  p[9] = uVar2;
  p[10] = uVar1;
  p[0xb] = (uchar)location;
  p[0xc] = (uchar)offset;
  uVar1 = (uchar)((uint)offset >> 8);
  p[0xd] = uVar1;
  uVar2 = (uchar)((uint)offset >> 0x10);
  p[0xe] = uVar2;
  uVar3 = (uchar)((uint)offset >> 0x18);
  p[0xf] = uVar3;
  p[0x10] = uVar3;
  p[0x11] = uVar2;
  p[0x12] = uVar1;
  p[0x13] = (uchar)offset;
  p[0x14] = (uchar)size;
  uVar1 = (uchar)((uint)size >> 8);
  p[0x15] = uVar1;
  uVar2 = (uchar)((uint)size >> 0x10);
  p[0x16] = uVar2;
  uVar3 = (uchar)((uint)size >> 0x18);
  p[0x17] = uVar3;
  p[0x18] = uVar3;
  p[0x19] = uVar2;
  p[0x1a] = uVar1;
  p[0x1b] = (uchar)size;
  return (uint)size >> 8;
}

Assistant:

static int
set_SUSP_CE(unsigned char *p, int location, int offset, int size)
{
	unsigned char *bp = p -1;
	/*  Extend the System Use Area
	 *   "CE" Format:
	 *               len  ver
	 *    +----+----+----+----+-----------+-----------+
	 *    | 'C'| 'E'| 1C | 01 | LOCATION1 | LOCATION2 |
	 *    +----+----+----+----+-----------+-----------+
	 *    0    1    2    3    4          12          20
	 *    +-----------+
	 *    | LOCATION3 |
	 *    +-----------+
	 *   20          28
	 *   LOCATION1 : Location of Continuation of System Use Area.
	 *   LOCATION2 : Offset to Start of Continuation.
	 *   LOCATION3 : Length of the Continuation.
	 */

	bp[1] = 'C';
	bp[2] = 'E';
	bp[3] = RR_CE_SIZE;	/* length	*/
	bp[4] = 1;		/* version	*/
	set_num_733(bp+5, location);
	set_num_733(bp+13, offset);
	set_num_733(bp+21, size);
	return (RR_CE_SIZE);
}